

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase194::run(TestCase194 *this)

{
  Builder reader;
  Reader reader_00;
  Reader reader_01;
  Reader reader_02;
  Builder builder_00;
  Reader reader_03;
  Builder builder_01;
  Reader reader_04;
  Reader reader_05;
  Reader reader_06;
  initializer_list<unsigned_int> expected;
  initializer_list<unsigned_int> expected_00;
  initializer_list<unsigned_int> expected_01;
  initializer_list<unsigned_int> expected_02;
  uint uVar1;
  uint uVar2;
  undefined8 in_stack_fffffffffffff288;
  undefined8 in_stack_fffffffffffff290;
  uint local_cb8 [4];
  iterator local_ca8;
  undefined8 local_ca0;
  Type local_c98;
  ArrayPtr<const_char> local_c88;
  Builder local_c78;
  BuilderFor<capnp::AnyPointer> local_c38;
  BuilderFor<capnp::DynamicList> local_c20;
  uint local_be8 [4];
  iterator local_bd8;
  undefined8 local_bd0;
  Type local_bc8;
  ArrayPtr<const_char> local_bb8;
  Builder local_ba8;
  BuilderFor<capnp::AnyPointer> local_b68;
  Reader local_b50;
  ReaderFor<capnp::DynamicList> local_b30;
  uint local_af0 [4];
  iterator local_ae0;
  undefined8 local_ad8;
  Type local_ad0;
  ArrayPtr<const_char> local_ac0;
  Reader local_ab0;
  Reader local_a78;
  ReaderFor<capnp::AnyPointer> local_a30;
  ReaderFor<capnp::DynamicList> local_a10;
  uint local_9d0 [4];
  iterator local_9c0;
  undefined8 local_9b8;
  Type local_9b0;
  ArrayPtr<const_char> local_9a0;
  Reader local_990;
  Reader local_958;
  ReaderFor<capnp::AnyPointer> local_910;
  ReaderFor<capnp::DynamicList> local_8f0;
  uint local_8b0 [2];
  bool local_8a5;
  uint local_8a4;
  uint uStack_8a0;
  bool _kj_shouldLog_3;
  bool local_899;
  uint local_898;
  uint uStack_894;
  bool _kj_shouldLog_2;
  bool local_88d;
  uint local_88c;
  uint uStack_888;
  bool _kj_shouldLog_1;
  bool local_881;
  uint local_880;
  uint uStack_87c;
  bool _kj_shouldLog;
  Fault local_878;
  Fault f;
  Reader local_838;
  Reader local_808;
  undefined1 local_7e8 [8];
  ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> list_1;
  Reader local_770;
  Reader local_728;
  Reader local_6e0;
  Type local_698;
  StringPtr local_688;
  Builder local_678;
  BuilderFor<capnp::AnyPointer> local_638;
  undefined1 local_620 [8];
  BuilderFor<capnp::DynamicList> list;
  ArrayPtr<const_char> local_5e0;
  Builder local_5d0;
  BuilderFor<capnp::AnyPointer> local_590;
  BuilderFor<capnp::DynamicStruct> local_578;
  Schema local_548;
  ArrayPtr<const_char> local_540;
  Builder local_530;
  BuilderFor<capnp::AnyPointer> local_4f0;
  Reader local_4d8;
  ReaderFor<capnp::DynamicStruct> local_4b8;
  Schema local_480;
  ArrayPtr<const_char> local_478;
  Reader local_468;
  Reader local_430;
  ReaderFor<capnp::AnyPointer> local_3e8;
  ReaderFor<capnp::DynamicStruct> local_3c8;
  Schema local_390;
  ArrayPtr<const_char> local_388;
  Reader local_378;
  Reader local_340;
  ReaderFor<capnp::AnyPointer> local_2f8;
  ReaderFor<capnp::DynamicStruct> local_2d8;
  Reader local_2a0;
  Reader local_268;
  Reader local_238;
  ReaderFor<capnproto_test::capnp::test::TestAllTypes> local_218;
  Schema local_1e8;
  ArrayPtr<const_char> local_1e0;
  Builder local_1d0;
  BuilderFor<capnp::AnyPointer> local_190;
  BuilderFor<capnp::DynamicStruct> local_178;
  Schema local_138;
  undefined1 local_130 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase194 *this_local;
  
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&root.builder.dataSize,0x400,GROW_HEURISTICALLY);
  local_138.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestAnyPointer>();
  MessageBuilder::getRoot<capnp::DynamicStruct,capnp::StructSchema>
            ((Builder *)local_130,(MessageBuilder *)&root.builder.dataSize,
             (StructSchema)local_138.raw);
  kj::StringPtr::StringPtr((StringPtr *)&local_1e0,"anyPointerField");
  DynamicStruct::Builder::get(&local_1d0,(Builder *)local_130,(StringPtr)local_1e0);
  DynamicValue::Builder::as<capnp::AnyPointer>(&local_190,&local_1d0);
  local_1e8.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestAllTypes>();
  AnyPointer::Builder::initAs<capnp::DynamicStruct>
            (&local_178,&local_190,(StructSchema)local_1e8.raw);
  builder_00.builder.segment = (SegmentBuilder *)local_178.builder.capTable;
  builder_00.schema.super_Schema.raw = (Schema)(Schema)local_178.builder.segment;
  builder_00.builder.capTable = (CapTableBuilder *)local_178.builder.data;
  builder_00.builder.data = local_178.builder.pointers;
  builder_00.builder.pointers = (WirePointer *)local_178.builder._32_8_;
  builder_00.builder.dataSize = (int)in_stack_fffffffffffff288;
  builder_00.builder.pointerCount = (short)((ulong)in_stack_fffffffffffff288 >> 0x20);
  builder_00.builder._38_2_ = (short)((ulong)in_stack_fffffffffffff288 >> 0x30);
  initDynamicTestMessage(builder_00);
  DynamicValue::Builder::~Builder(&local_1d0);
  DynamicStruct::Builder::asReader(&local_2a0,(Builder *)local_130);
  DynamicStruct::Reader::as<capnproto_test::capnp::test::TestAnyPointer>(&local_268,&local_2a0);
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField(&local_238,&local_268);
  AnyPointer::Reader::getAs<capnproto_test::capnp::test::TestAllTypes>(&local_218,&local_238);
  reader_03._reader.capTable = (CapTableReader *)local_218._reader.data;
  reader_03._reader.segment = (SegmentReader *)local_218._reader.capTable;
  reader_03._reader.data = local_218._reader.pointers;
  reader_03._reader.pointers = (WirePointer *)local_218._reader._32_8_;
  reader_03._reader.dataSize = local_218._reader.nestingLimit;
  reader_03._reader.pointerCount = local_218._reader._44_2_;
  reader_03._reader._38_2_ = local_218._reader._46_2_;
  reader_03._reader._40_8_ = in_stack_fffffffffffff288;
  checkTestMessage(reader_03);
  DynamicStruct::Builder::asReader(&local_378,(Builder *)local_130);
  kj::StringPtr::StringPtr((StringPtr *)&local_388,"anyPointerField");
  DynamicStruct::Reader::get(&local_340,&local_378,(StringPtr)local_388);
  DynamicValue::Reader::as<capnp::AnyPointer>(&local_2f8,&local_340);
  local_390.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestAllTypes>();
  AnyPointer::Reader::getAs<capnp::DynamicStruct>(&local_2d8,&local_2f8,(StructSchema)local_390.raw)
  ;
  reader_04.reader.segment = (SegmentReader *)local_2d8.reader.capTable;
  reader_04.schema.super_Schema.raw = (Schema)(Schema)local_2d8.reader.segment;
  reader_04.reader.capTable = (CapTableReader *)local_2d8.reader.data;
  reader_04.reader.data = local_2d8.reader.pointers;
  reader_04.reader.pointers = (WirePointer *)local_2d8.reader._32_8_;
  reader_04.reader.dataSize = local_2d8.reader.nestingLimit;
  reader_04.reader.pointerCount = local_2d8.reader._44_2_;
  reader_04.reader._38_2_ = local_2d8.reader._46_2_;
  reader_04.reader._40_8_ = in_stack_fffffffffffff290;
  checkDynamicTestMessage(reader_04);
  DynamicValue::Reader::~Reader(&local_340);
  DynamicStruct::Builder::asReader(&local_468,(Builder *)local_130);
  kj::StringPtr::StringPtr((StringPtr *)&local_478,"anyPointerField");
  DynamicStruct::Reader::get(&local_430,&local_468,(StringPtr)local_478);
  DynamicValue::Reader::as<capnp::AnyPointer>(&local_3e8,&local_430);
  local_480.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestAllTypes>();
  AnyPointer::Reader::getAs<capnp::DynamicStruct>(&local_3c8,&local_3e8,(StructSchema)local_480.raw)
  ;
  reader_05.reader.segment = (SegmentReader *)local_3c8.reader.capTable;
  reader_05.schema.super_Schema.raw = (Schema)(Schema)local_3c8.reader.segment;
  reader_05.reader.capTable = (CapTableReader *)local_3c8.reader.data;
  reader_05.reader.data = local_3c8.reader.pointers;
  reader_05.reader.pointers = (WirePointer *)local_3c8.reader._32_8_;
  reader_05.reader.dataSize = local_3c8.reader.nestingLimit;
  reader_05.reader.pointerCount = local_3c8.reader._44_2_;
  reader_05.reader._38_2_ = local_3c8.reader._46_2_;
  reader_05.reader._40_8_ = in_stack_fffffffffffff290;
  checkDynamicTestMessage(reader_05);
  DynamicValue::Reader::~Reader(&local_430);
  kj::StringPtr::StringPtr((StringPtr *)&local_540,"anyPointerField");
  DynamicStruct::Builder::get(&local_530,(Builder *)local_130,(StringPtr)local_540);
  DynamicValue::Builder::as<capnp::AnyPointer>(&local_4f0,&local_530);
  AnyPointer::Builder::asReader(&local_4d8,&local_4f0);
  local_548.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestAllTypes>();
  AnyPointer::Reader::getAs<capnp::DynamicStruct>(&local_4b8,&local_4d8,(StructSchema)local_548.raw)
  ;
  reader_06.reader.segment = (SegmentReader *)local_4b8.reader.capTable;
  reader_06.schema.super_Schema.raw = (Schema)(Schema)local_4b8.reader.segment;
  reader_06.reader.capTable = (CapTableReader *)local_4b8.reader.data;
  reader_06.reader.data = local_4b8.reader.pointers;
  reader_06.reader.pointers = (WirePointer *)local_4b8.reader._32_8_;
  reader_06.reader.dataSize = local_4b8.reader.nestingLimit;
  reader_06.reader.pointerCount = local_4b8.reader._44_2_;
  reader_06.reader._38_2_ = local_4b8.reader._46_2_;
  reader_06.reader._40_8_ = in_stack_fffffffffffff290;
  checkDynamicTestMessage(reader_06);
  DynamicValue::Builder::~Builder(&local_530);
  kj::StringPtr::StringPtr((StringPtr *)&local_5e0,"anyPointerField");
  DynamicStruct::Builder::get(&local_5d0,(Builder *)local_130,(StringPtr)local_5e0);
  DynamicValue::Builder::as<capnp::AnyPointer>(&local_590,&local_5d0);
  list.builder._32_8_ = Schema::from<capnproto_test::capnp::test::TestAllTypes>();
  AnyPointer::Builder::getAs<capnp::DynamicStruct>
            (&local_578,&local_590,(StructSchema)list.builder._32_8_);
  builder_01.builder.segment = (SegmentBuilder *)local_578.builder.capTable;
  builder_01.schema.super_Schema.raw = (Schema)(Schema)local_578.builder.segment;
  builder_01.builder.capTable = (CapTableBuilder *)local_578.builder.data;
  builder_01.builder.data = local_578.builder.pointers;
  builder_01.builder.pointers = (WirePointer *)local_578.builder._32_8_;
  builder_01.builder.dataSize = local_4b8.reader.nestingLimit;
  builder_01.builder.pointerCount = local_4b8.reader._44_2_;
  builder_01.builder._38_2_ = local_4b8.reader._46_2_;
  checkDynamicTestMessage(builder_01);
  DynamicValue::Builder::~Builder(&local_5d0);
  kj::StringPtr::StringPtr(&local_688,"anyPointerField");
  DynamicStruct::Builder::init((Builder *)&local_678,(EVP_PKEY_CTX *)local_130);
  DynamicValue::Builder::as<capnp::AnyPointer>(&local_638,&local_678);
  local_698 = (Type)Schema::from<capnp::List<unsigned_int,(capnp::Kind)0>>();
  AnyPointer::Builder::initAs<capnp::DynamicList>
            ((BuilderFor<capnp::DynamicList> *)local_620,&local_638,(ListSchema)local_698,4);
  DynamicValue::Builder::~Builder(&local_678);
  DynamicValue::Reader::Reader(&local_6e0,0x7b);
  DynamicList::Builder::set((Builder *)local_620,0,&local_6e0);
  DynamicValue::Reader::~Reader(&local_6e0);
  DynamicValue::Reader::Reader(&local_728,0x1c8);
  DynamicList::Builder::set((Builder *)local_620,1,&local_728);
  DynamicValue::Reader::~Reader(&local_728);
  DynamicValue::Reader::Reader(&local_770,0x315);
  DynamicList::Builder::set((Builder *)local_620,2,&local_770);
  DynamicValue::Reader::~Reader(&local_770);
  DynamicValue::Reader::Reader((Reader *)&list_1.reader.nestingLimit,0x75bcd15);
  DynamicList::Builder::set((Builder *)local_620,3,(Reader *)&list_1.reader.nestingLimit);
  DynamicValue::Reader::~Reader((Reader *)&list_1.reader.nestingLimit);
  DynamicStruct::Builder::asReader((Reader *)&f,(Builder *)local_130);
  DynamicStruct::Reader::as<capnproto_test::capnp::test::TestAnyPointer>(&local_838,(Reader *)&f);
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField(&local_808,&local_838);
  AnyPointer::Reader::getAs<capnp::List<unsigned_int,(capnp::Kind)0>>
            ((ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_7e8,&local_808);
  uVar1 = List<unsigned_int,_(capnp::Kind)0>::Reader::size((Reader *)local_7e8);
  if (uVar1 != 4) {
    uStack_87c = 4;
    local_880 = List<unsigned_int,_(capnp::Kind)0>::Reader::size((Reader *)local_7e8);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_878,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0xe6,FAILED,"(4u) == (list.size())","4u, list.size()",&stack0xfffffffffffff784,
               &local_880);
    kj::_::Debug::Fault::fatal(&local_878);
  }
  uVar2 = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_7e8,0);
  if (uVar2 != 0x7b) {
    local_881 = kj::_::Debug::shouldLog(ERROR);
    while (local_881 != false) {
      uStack_888 = 0x7b;
      local_88c = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_7e8,0);
      kj::_::Debug::log<char_const(&)[37],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0xe7,ERROR,"\"failed: expected \" \"(123u) == (list[0])\", 123u, list[0]",
                 (char (*) [37])"failed: expected (123u) == (list[0])",&stack0xfffffffffffff778,
                 &local_88c);
      local_881 = false;
    }
  }
  uVar2 = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_7e8,1);
  if (uVar2 != 0x1c8) {
    local_88d = kj::_::Debug::shouldLog(ERROR);
    while (local_88d != false) {
      uStack_894 = 0x1c8;
      local_898 = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_7e8,1);
      kj::_::Debug::log<char_const(&)[37],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0xe8,ERROR,"\"failed: expected \" \"(456u) == (list[1])\", 456u, list[1]",
                 (char (*) [37])"failed: expected (456u) == (list[1])",&stack0xfffffffffffff76c,
                 &local_898);
      local_88d = false;
    }
  }
  uVar2 = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_7e8,2);
  if (uVar2 != 0x315) {
    local_899 = kj::_::Debug::shouldLog(ERROR);
    while (local_899 != false) {
      uStack_8a0 = 0x315;
      local_8a4 = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_7e8,2);
      kj::_::Debug::log<char_const(&)[37],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0xe9,ERROR,"\"failed: expected \" \"(789u) == (list[2])\", 789u, list[2]",
                 (char (*) [37])"failed: expected (789u) == (list[2])",&stack0xfffffffffffff760,
                 &local_8a4);
      local_899 = false;
    }
  }
  uVar2 = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_7e8,3);
  if (uVar2 != 0x75bcd15) {
    local_8a5 = kj::_::Debug::shouldLog(ERROR);
    while (local_8a5 != false) {
      local_8b0[1] = 0x75bcd15;
      local_8b0[0] = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_7e8,3);
      kj::_::Debug::log<char_const(&)[43],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0xea,ERROR,
                 "\"failed: expected \" \"(123456789u) == (list[3])\", 123456789u, list[3]",
                 (char (*) [43])"failed: expected (123456789u) == (list[3])",local_8b0 + 1,local_8b0
                );
      local_8a5 = false;
    }
  }
  DynamicStruct::Builder::asReader(&local_990,(Builder *)local_130);
  kj::StringPtr::StringPtr((StringPtr *)&local_9a0,"anyPointerField");
  DynamicStruct::Reader::get(&local_958,&local_990,(StringPtr)local_9a0);
  DynamicValue::Reader::as<capnp::AnyPointer>(&local_910,&local_958);
  local_9b0 = (Type)Schema::from<capnp::List<unsigned_int,(capnp::Kind)0>>();
  AnyPointer::Reader::getAs<capnp::DynamicList>(&local_8f0,&local_910,(ListSchema)local_9b0);
  local_9d0[0] = 0x7b;
  local_9d0[1] = 0x1c8;
  local_9d0[2] = 0x315;
  local_9d0[3] = 0x75bcd15;
  local_9c0 = local_9d0;
  local_9b8 = 4;
  expected_02._M_len = 4;
  expected_02._M_array = local_9c0;
  reader_00.schema.elementType.field_4.schema = local_8f0.schema.elementType.field_4.schema;
  reader_00.schema.elementType.baseType = local_8f0.schema.elementType.baseType;
  reader_00.schema.elementType.listDepth = local_8f0.schema.elementType.listDepth;
  reader_00.schema.elementType.isImplicitParam = local_8f0.schema.elementType.isImplicitParam;
  reader_00.schema.elementType.field_3 = local_8f0.schema.elementType.field_3;
  reader_00.schema.elementType._6_2_ = local_8f0.schema.elementType._6_2_;
  reader_00.reader.segment = local_8f0.reader.segment;
  reader_00.reader.capTable = local_8f0.reader.capTable;
  reader_00.reader.ptr = local_8f0.reader.ptr;
  reader_00.reader.elementCount = local_8f0.reader.elementCount;
  reader_00.reader.step = local_8f0.reader.step;
  reader_00.reader.structDataSize = local_8f0.reader.structDataSize;
  reader_00.reader.structPointerCount = local_8f0.reader.structPointerCount;
  reader_00.reader.elementSize = local_8f0.reader.elementSize;
  reader_00.reader._39_1_ = local_8f0.reader._39_1_;
  reader_00.reader.nestingLimit = local_8f0.reader.nestingLimit;
  reader_00.reader._44_4_ = local_8f0.reader._44_4_;
  (anonymous_namespace)::checkList<unsigned_int,capnp::DynamicList::Reader>(reader_00,expected_02);
  DynamicValue::Reader::~Reader(&local_958);
  DynamicStruct::Builder::asReader(&local_ab0,(Builder *)local_130);
  kj::StringPtr::StringPtr((StringPtr *)&local_ac0,"anyPointerField");
  DynamicStruct::Reader::get(&local_a78,&local_ab0,(StringPtr)local_ac0);
  DynamicValue::Reader::as<capnp::AnyPointer>(&local_a30,&local_a78);
  local_ad0 = (Type)Schema::from<capnp::List<unsigned_int,(capnp::Kind)0>>();
  AnyPointer::Reader::getAs<capnp::DynamicList>(&local_a10,&local_a30,(ListSchema)local_ad0);
  local_af0[0] = 0x7b;
  local_af0[1] = 0x1c8;
  local_af0[2] = 0x315;
  local_af0[3] = 0x75bcd15;
  local_ae0 = local_af0;
  local_ad8 = 4;
  expected_01._M_len = 4;
  expected_01._M_array = local_ae0;
  reader_01.schema.elementType.field_4.schema = local_a10.schema.elementType.field_4.schema;
  reader_01.schema.elementType.baseType = local_a10.schema.elementType.baseType;
  reader_01.schema.elementType.listDepth = local_a10.schema.elementType.listDepth;
  reader_01.schema.elementType.isImplicitParam = local_a10.schema.elementType.isImplicitParam;
  reader_01.schema.elementType.field_3 = local_a10.schema.elementType.field_3;
  reader_01.schema.elementType._6_2_ = local_a10.schema.elementType._6_2_;
  reader_01.reader.segment = local_a10.reader.segment;
  reader_01.reader.capTable = local_a10.reader.capTable;
  reader_01.reader.ptr = local_a10.reader.ptr;
  reader_01.reader.elementCount = local_a10.reader.elementCount;
  reader_01.reader.step = local_a10.reader.step;
  reader_01.reader.structDataSize = local_a10.reader.structDataSize;
  reader_01.reader.structPointerCount = local_a10.reader.structPointerCount;
  reader_01.reader.elementSize = local_a10.reader.elementSize;
  reader_01.reader._39_1_ = local_a10.reader._39_1_;
  reader_01.reader.nestingLimit = local_a10.reader.nestingLimit;
  reader_01.reader._44_4_ = local_a10.reader._44_4_;
  (anonymous_namespace)::checkList<unsigned_int,capnp::DynamicList::Reader>(reader_01,expected_01);
  DynamicValue::Reader::~Reader(&local_a78);
  kj::StringPtr::StringPtr((StringPtr *)&local_bb8,"anyPointerField");
  DynamicStruct::Builder::get(&local_ba8,(Builder *)local_130,(StringPtr)local_bb8);
  DynamicValue::Builder::as<capnp::AnyPointer>(&local_b68,&local_ba8);
  AnyPointer::Builder::asReader(&local_b50,&local_b68);
  local_bc8 = (Type)Schema::from<capnp::List<unsigned_int,(capnp::Kind)0>>();
  AnyPointer::Reader::getAs<capnp::DynamicList>(&local_b30,&local_b50,(ListSchema)local_bc8);
  local_be8[0] = 0x7b;
  local_be8[1] = 0x1c8;
  local_be8[2] = 0x315;
  local_be8[3] = 0x75bcd15;
  local_bd8 = local_be8;
  local_bd0 = 4;
  expected_00._M_len = 4;
  expected_00._M_array = local_bd8;
  reader_02.schema.elementType.field_4.schema = local_b30.schema.elementType.field_4.schema;
  reader_02.schema.elementType.baseType = local_b30.schema.elementType.baseType;
  reader_02.schema.elementType.listDepth = local_b30.schema.elementType.listDepth;
  reader_02.schema.elementType.isImplicitParam = local_b30.schema.elementType.isImplicitParam;
  reader_02.schema.elementType.field_3 = local_b30.schema.elementType.field_3;
  reader_02.schema.elementType._6_2_ = local_b30.schema.elementType._6_2_;
  reader_02.reader.segment = local_b30.reader.segment;
  reader_02.reader.capTable = local_b30.reader.capTable;
  reader_02.reader.ptr = local_b30.reader.ptr;
  reader_02.reader.elementCount = local_b30.reader.elementCount;
  reader_02.reader.step = local_b30.reader.step;
  reader_02.reader.structDataSize = local_b30.reader.structDataSize;
  reader_02.reader.structPointerCount = local_b30.reader.structPointerCount;
  reader_02.reader.elementSize = local_b30.reader.elementSize;
  reader_02.reader._39_1_ = local_b30.reader._39_1_;
  reader_02.reader.nestingLimit = local_b30.reader.nestingLimit;
  reader_02.reader._44_4_ = local_b30.reader._44_4_;
  (anonymous_namespace)::checkList<unsigned_int,capnp::DynamicList::Reader>(reader_02,expected_00);
  DynamicValue::Builder::~Builder(&local_ba8);
  kj::StringPtr::StringPtr((StringPtr *)&local_c88,"anyPointerField");
  DynamicStruct::Builder::get(&local_c78,(Builder *)local_130,(StringPtr)local_c88);
  DynamicValue::Builder::as<capnp::AnyPointer>(&local_c38,&local_c78);
  local_c98 = (Type)Schema::from<capnp::List<unsigned_int,(capnp::Kind)0>>();
  AnyPointer::Builder::getAs<capnp::DynamicList>(&local_c20,&local_c38,(ListSchema)local_c98);
  local_cb8[0] = 0x7b;
  local_cb8[1] = 0x1c8;
  local_cb8[2] = 0x315;
  local_cb8[3] = 0x75bcd15;
  local_ca8 = local_cb8;
  local_ca0 = 4;
  expected._M_len = 4;
  expected._M_array = local_ca8;
  reader.schema.elementType.field_4.schema = local_c20.schema.elementType.field_4.schema;
  reader.schema.elementType.baseType = local_c20.schema.elementType.baseType;
  reader.schema.elementType.listDepth = local_c20.schema.elementType.listDepth;
  reader.schema.elementType.isImplicitParam = local_c20.schema.elementType.isImplicitParam;
  reader.schema.elementType.field_3 = local_c20.schema.elementType.field_3;
  reader.schema.elementType._6_2_ = local_c20.schema.elementType._6_2_;
  reader.builder.segment = local_c20.builder.segment;
  reader.builder.capTable = local_c20.builder.capTable;
  reader.builder.ptr = local_c20.builder.ptr;
  reader.builder.elementCount = local_c20.builder.elementCount;
  reader.builder.step = local_c20.builder.step;
  reader.builder.structDataSize = local_c20.builder.structDataSize;
  reader.builder.structPointerCount = local_c20.builder.structPointerCount;
  reader.builder.elementSize = local_c20.builder.elementSize;
  reader.builder._39_1_ = local_c20.builder._39_1_;
  (anonymous_namespace)::checkList<unsigned_int,capnp::DynamicList::Builder>(reader,expected);
  DynamicValue::Builder::~Builder(&local_c78);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root.builder.dataSize);
  return;
}

Assistant:

TEST(DynamicApi, DynamicAnyPointers) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<DynamicStruct>(Schema::from<test::TestAnyPointer>());

  initDynamicTestMessage(
      root.get("anyPointerField").as<AnyPointer>()
          .initAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkTestMessage(
      root.asReader().as<test::TestAnyPointer>().getAnyPointerField().getAs<TestAllTypes>());

  checkDynamicTestMessage(
      root.asReader().get("anyPointerField").as<AnyPointer>()
          .getAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkDynamicTestMessage(
      root.asReader().get("anyPointerField").as<AnyPointer>()
          .getAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkDynamicTestMessage(
      root.get("anyPointerField").as<AnyPointer>().asReader()
          .getAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkDynamicTestMessage(
      root.get("anyPointerField").as<AnyPointer>()
          .getAs<DynamicStruct>(Schema::from<TestAllTypes>()));

  {
    {
      auto list = root.init("anyPointerField").as<AnyPointer>()
                      .initAs<DynamicList>(Schema::from<List<uint32_t>>(), 4);
      list.set(0, 123);
      list.set(1, 456);
      list.set(2, 789);
      list.set(3, 123456789);
    }

    {
      auto list = root.asReader().as<test::TestAnyPointer>()
          .getAnyPointerField().getAs<List<uint32_t>>();
      ASSERT_EQ(4u, list.size());
      EXPECT_EQ(123u, list[0]);
      EXPECT_EQ(456u, list[1]);
      EXPECT_EQ(789u, list[2]);
      EXPECT_EQ(123456789u, list[3]);
    }

    checkList<uint32_t>(
        root.asReader().get("anyPointerField").as<AnyPointer>()
            .getAs<DynamicList>(Schema::from<List<uint32_t>>()),
        {123u, 456u, 789u, 123456789u});
    checkList<uint32_t>(
        root.asReader().get("anyPointerField").as<AnyPointer>()
            .getAs<DynamicList>(Schema::from<List<uint32_t>>()),
        {123u, 456u, 789u, 123456789u});
    checkList<uint32_t>(
        root.get("anyPointerField").as<AnyPointer>().asReader()
            .getAs<DynamicList>(Schema::from<List<uint32_t>>()),
        {123u, 456u, 789u, 123456789u});
    checkList<uint32_t>(
        root.get("anyPointerField").as<AnyPointer>()
            .getAs<DynamicList>(Schema::from<List<uint32_t>>()),
        {123u, 456u, 789u, 123456789u});
  }
}